

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptFunction.cpp
# Opt level: O2

void __thiscall
Js::ScriptFunction::ExtractSnapObjectDataIntoSnapScriptFunctionInfo
          (ScriptFunction *this,void *snapScriptFunctionInfo,SlabAllocator *alloc)

{
  FrameDisplay *pFVar1;
  ActivationObjectEx *pAVar2;
  int iVar3;
  ParseableFunctionInfo *pfi;
  FunctionBody *pFVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  
  pfi = JavascriptFunction::GetParseableFunctionInfo((JavascriptFunction *)this);
  pFVar4 = TTD::JsSupport::ForceAndGetFunctionBody(pfi);
  iVar3 = (*(pFVar4->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
            super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])(pFVar4);
  TTD::SlabAllocatorBase<0>::CopyNullTermStringInto
            (alloc,(char16 *)CONCAT44(extraout_var,iVar3),(TTString *)snapScriptFunctionInfo);
  *(FunctionBody **)((long)snapScriptFunctionInfo + 0x10) = pFVar4;
  pFVar1 = (this->environment).ptr;
  *(undefined8 *)((long)snapScriptFunctionInfo + 0x18) = 0;
  if (pFVar1->length != 0) {
    *(FrameDisplay **)((long)snapScriptFunctionInfo + 0x18) = pFVar1;
  }
  *(undefined8 *)((long)snapScriptFunctionInfo + 0x20) = 0;
  pAVar2 = (this->cachedScopeObj).ptr;
  if (pAVar2 != (ActivationObjectEx *)0x0) {
    *(ActivationObjectEx **)((long)snapScriptFunctionInfo + 0x20) = pAVar2;
  }
  *(undefined8 *)((long)snapScriptFunctionInfo + 0x28) = 0;
  iVar3 = (*(this->super_ScriptFunctionBase).super_JavascriptFunction.super_DynamicObject.
            super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0x73])(this);
  if (CONCAT44(extraout_var_00,iVar3) != 0) {
    iVar3 = (*(this->super_ScriptFunctionBase).super_JavascriptFunction.super_DynamicObject.
              super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x73])(this);
    *(ulong *)((long)snapScriptFunctionInfo + 0x28) = CONCAT44(extraout_var_01,iVar3);
  }
  iVar3 = (*(this->super_ScriptFunctionBase).super_JavascriptFunction.super_DynamicObject.
            super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0x76])(this);
  *(ulong *)((long)snapScriptFunctionInfo + 0x30) = CONCAT44(extraout_var_02,iVar3);
  return;
}

Assistant:

void ScriptFunction::ExtractSnapObjectDataIntoSnapScriptFunctionInfo(/*TTD::NSSnapObjects::SnapScriptFunctionInfo* */ void* snapScriptFunctionInfo, TTD::SlabAllocator& alloc)
    {
        TTD::NSSnapObjects::SnapScriptFunctionInfo* ssfi = reinterpret_cast<TTD::NSSnapObjects::SnapScriptFunctionInfo*>(snapScriptFunctionInfo);

        Js::FunctionBody* fb = TTD::JsSupport::ForceAndGetFunctionBody(this->GetParseableFunctionInfo());

        alloc.CopyNullTermStringInto(fb->GetDisplayName(), ssfi->DebugFunctionName);

        ssfi->BodyRefId = TTD_CONVERT_FUNCTIONBODY_TO_PTR_ID(fb);

        Js::FrameDisplay* environment = this->GetEnvironment();
        ssfi->ScopeId = TTD_INVALID_PTR_ID;
        if (environment->GetLength() != 0)
        {
            ssfi->ScopeId = TTD_CONVERT_SCOPE_TO_PTR_ID(environment);
        }

        ssfi->CachedScopeObjId = TTD_INVALID_PTR_ID;
        if (this->cachedScopeObj != nullptr)
        {
            ssfi->CachedScopeObjId = TTD_CONVERT_VAR_TO_PTR_ID(this->cachedScopeObj);
        }

        ssfi->HomeObjId = TTD_INVALID_PTR_ID;
        if (this->GetHomeObj() != nullptr)
        {
            ssfi->HomeObjId = TTD_CONVERT_VAR_TO_PTR_ID(this->GetHomeObj());
        }

        ssfi->ComputedNameInfo = TTD_CONVERT_JSVAR_TO_TTDVAR(this->GetComputedNameVar());
    }